

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagBuilder.cpp
# Opt level: O2

DiagBuilder * __thiscall Mond::DiagBuilder::operator<<(DiagBuilder *this,DiagSentinel b)

{
  undefined1 local_78 [24];
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined8 local_40;
  allocator local_29;
  
  WriteRest(this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&(this->m_diag).message,(string *)local_78);
  std::__cxx11::string::~string((string *)local_78);
  std::function<void_(const_Mond::Diag_&)>::operator()(&this->m_func,&this->m_diag);
  this->m_pos = 0;
  this->m_fmt = (char *)0x0;
  std::__cxx11::string::string((string *)local_78,"",&local_29);
  std::__cxx11::stringbuf::str((string *)&this->field_0x68);
  std::__cxx11::string::~string((string *)local_78);
  local_60._M_p = (pointer)&local_50;
  local_40._0_4_ = Info;
  local_40._4_4_ = LexUnexpectedCharacter;
  local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )0x0;
  local_78._0_4_ = -1;
  local_78._4_4_ = -1;
  local_78._8_4_ = -1;
  local_78._12_4_ = -1;
  local_78._16_4_ = -1;
  local_78._20_4_ = -1;
  local_58 = 0;
  Diag::operator=(&this->m_diag,(Diag *)local_78);
  std::__cxx11::string::~string((string *)&local_60);
  return this;
}

Assistant:

DiagBuilder &DiagBuilder::operator<<(DiagSentinel b)
{
	WriteRest();

	m_diag.message = m_msg.str();
	m_func(m_diag);

	m_pos = 0;
	m_fmt = NULL;
	m_msg.str("");
	m_diag = Diag();

	return *this;
}